

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  uint uVar1;
  u32 uVar2;
  u32 *puVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint *a;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int n;
  u32 local_bc;
  long local_b0;
  u32 *page0;
  i64 nSize;
  undefined8 local_88;
  undefined8 uStack_80;
  uint *local_78;
  uint *local_70;
  u32 *local_68;
  u32 *local_60;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  
  iVar6 = walIndexPage(pWal,0,&page0);
  if (iVar6 != 0) {
    return iVar6;
  }
  if ((page0 != (u32 *)0x0) && (iVar6 = walIndexTryHdr(pWal,pChanged), iVar6 == 0)) {
    iVar6 = 0;
    goto LAB_0011fecc;
  }
  if ((pWal->readOnly & 2) != 0) {
    iVar6 = walLockShared(pWal,0);
    if (iVar6 != 0) {
      return iVar6;
    }
    walUnlockShared(pWal,0);
    return 0x108;
  }
  iVar6 = walLockExclusive(pWal,0,1);
  if (iVar6 != 0) {
    return iVar6;
  }
  pWal->writeLock = '\x01';
  iVar6 = 0;
  iVar7 = walIndexPage(pWal,0,&page0);
  if (iVar7 == 0) {
    iVar7 = walIndexTryHdr(pWal,pChanged);
    if (iVar7 == 0) {
      bVar4 = true;
    }
    else {
      n = 7 - (uint)pWal->ckptLock;
      iVar7 = pWal->ckptLock + 1;
      iVar6 = walLockExclusive(pWal,iVar7,n);
      if (iVar6 == 0) {
        (pWal->hdr).aSalt[0] = 0;
        (pWal->hdr).aSalt[1] = 0;
        (pWal->hdr).aCksum[0] = 0;
        (pWal->hdr).aCksum[1] = 0;
        (pWal->hdr).mxFrame = 0;
        (pWal->hdr).nPage = 0;
        (pWal->hdr).aFrameCksum[0] = 0;
        (pWal->hdr).aFrameCksum[1] = 0;
        local_88 = 0;
        uStack_80 = 0;
        (pWal->hdr).iVersion = 0;
        (pWal->hdr).unused = 0;
        (pWal->hdr).iChange = 0;
        (pWal->hdr).isInit = '\0';
        (pWal->hdr).bigEndCksum = '\0';
        (pWal->hdr).szPage = 0;
        iVar6 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&nSize);
        if (iVar6 == 0) {
          if (0x20 < nSize) {
            iVar6 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_58,0x20,0);
            if (iVar6 != 0) goto LAB_0011fe9c;
            if ((local_58 >> 0x18 & 0xfffffffe | (local_58 & 0xff0000) >> 8 |
                 (local_58 & 0xff00) << 8 | local_58 << 0x18) == 0x377f0682) {
              uVar9 = local_50 >> 0x18 | (local_50 & 0xff0000) >> 8 | (local_50 & 0xff00) << 8 |
                      local_50 << 0x18;
              if (0xffff01fe < uVar9 - 0x10001 && (local_50 & local_50 - 1) == 0) {
                bVar5 = (byte)(local_58 >> 0x18) & 1;
                (pWal->hdr).bigEndCksum = bVar5;
                pWal->szPage = uVar9;
                pWal->nCkpt = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 |
                              (local_4c & 0xff00) << 8 | local_4c << 0x18;
                *(undefined8 *)(pWal->hdr).aSalt = local_48;
                local_60 = (pWal->hdr).aFrameCksum;
                walChecksumBytes((uint)(bVar5 ^ 1),(u8 *)&local_58,0x18,(u32 *)0x0,local_60);
                if (((pWal->hdr).aFrameCksum[0] ==
                     (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
                     local_40 << 0x18)) &&
                   ((pWal->hdr).aFrameCksum[1] ==
                    (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
                    local_3c << 0x18))) {
                  if (local_54 == 0x18e22d00) {
                    uVar10 = uVar9 + 0x18;
                    a = (uint *)sqlite3_malloc64((ulong)uVar10);
                    iVar6 = 7;
                    if (a != (uint *)0x0) {
                      local_68 = (pWal->hdr).aSalt;
                      local_78 = a + 6;
                      local_70 = a + 2;
                      local_88 = 0;
                      local_b0 = 0x20;
                      local_bc = 0;
                      do {
                        uStack_80 = 0;
                        lVar8 = local_b0;
                        do {
                          local_b0 = (ulong)uVar10 + lVar8;
                          iVar12 = 0;
                          iVar6 = iVar12;
                          if ((((nSize < local_b0) ||
                               (iVar6 = (*pWal->pWalFd->pMethods->xRead)
                                                  (pWal->pWalFd,a,uVar10,lVar8), puVar3 = local_60,
                               iVar6 != 0)) ||
                              (iVar6 = iVar12, *(long *)local_68 != *(long *)local_70)) ||
                             (uVar1 = *a, uVar1 == 0)) {
LAB_0011fe1d:
                            sqlite3_free(a);
                            if (iVar6 == 0) goto LAB_0011fe2b;
                            goto LAB_0011fe9c;
                          }
                          uVar11 = (uint)((pWal->hdr).bigEndCksum == '\0');
                          walChecksumBytes(uVar11,(u8 *)a,8,local_60,local_60);
                          walChecksumBytes(uVar11,(u8 *)local_78,pWal->szPage,puVar3,puVar3);
                          uVar11 = a[4];
                          iVar6 = 0;
                          if (((pWal->hdr).aFrameCksum[0] !=
                               (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                               uVar11 << 0x18)) ||
                             (uVar11 = a[5],
                             (pWal->hdr).aFrameCksum[1] !=
                             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                             uVar11 << 0x18))) goto LAB_0011fe1d;
                          local_bc = local_bc + 1;
                          uVar11 = a[1];
                          iVar6 = walIndexAppend(pWal,local_bc,
                                                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                 (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
                          if (iVar6 != 0) goto LAB_0011fe1d;
                          lVar8 = local_b0;
                        } while (uVar11 == 0);
                        (pWal->hdr).mxFrame = local_bc;
                        (pWal->hdr).nPage =
                             uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                             uVar11 << 0x18;
                        (pWal->hdr).szPage =
                             (ushort)(uVar9 >> 0x10) | (ushort)((local_50 & 0xff0000) >> 8);
                        local_88 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                      } while( true );
                    }
                  }
                  else {
                    iVar6 = sqlite3CantopenError(0xd8af);
                  }
                  goto LAB_0011fe9c;
                }
              }
            }
          }
LAB_0011fe2b:
          *(undefined8 *)(pWal->hdr).aFrameCksum = local_88;
          walIndexWriteHdr(pWal);
          puVar3 = *pWal->apWiData;
          puVar3[0x18] = 0;
          puVar3[0x20] = (pWal->hdr).mxFrame;
          puVar3[0x19] = 0;
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            puVar3[lVar8 + 0x1a] = 0xffffffff;
          }
          uVar2 = (pWal->hdr).mxFrame;
          if (uVar2 != 0) {
            puVar3[0x1a] = uVar2;
          }
          if ((pWal->hdr).nPage == 0) {
            iVar6 = 0;
          }
          else {
            iVar6 = 0;
            sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                        pWal->zWalName);
          }
        }
LAB_0011fe9c:
        walUnlockExclusive(pWal,iVar7,n);
      }
      *pChanged = 1;
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
    iVar6 = iVar7;
  }
  pWal->writeLock = '\0';
  walUnlockExclusive(pWal,0,1);
  if (!bVar4) {
    return iVar6;
  }
LAB_0011fecc:
  if ((pWal->hdr).iVersion != 0x2de218) {
    iVar6 = sqlite3CantopenError(0xdc68);
  }
  return iVar6;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}